

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.cpp
# Opt level: O2

SolutionCollection *
InferExamAnswers::Algorithm::runAlgorithm
          (SolutionCollection *__return_storage_ptr__,ExamResults *examResults)

{
  byte m;
  const_iterator cVar1;
  long lVar2;
  ulong uVar3;
  uint64_t uVar4;
  __node_base _Var5;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_unsigned_char,_unsigned_char>,_unsigned_char>
  local_c0;
  valarray<unsigned_char> leftScore;
  ScoreMap leftScores;
  ScoreMap rightScores;
  
  m = examResults->questionCount >> 1;
  computeScoreMap(&rightScores,examResults,'\0',m);
  computeScoreMap(&leftScores,examResults,m,examResults->questionCount);
  __return_storage_ptr__->_vptr_SolutionCollection = (_func_int **)&PTR__SolutionCollection_0011dd40
  ;
  __return_storage_ptr__->solution = 0;
  __return_storage_ptr__->size = 0;
  uVar4 = 0;
  uVar3 = 0;
  for (_Var5 = rightScores._M_h._M_before_begin; _Var5._M_nxt != (_Hash_node_base *)0x0;
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
    local_c0._M_closure.
    super__BinBase<std::__minus,_std::valarray<unsigned_char>,_std::valarray<unsigned_char>_>.
    _M_expr2 = (__type)(_Var5._M_nxt + 1);
    local_c0._M_closure.
    super__BinBase<std::__minus,_std::valarray<unsigned_char>,_std::valarray<unsigned_char>_>.
    _M_expr1 = &examResults->scores;
    std::valarray<unsigned_char>::
    valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,unsigned_char,unsigned_char>>
              (&leftScore,&local_c0);
    cVar1 = std::
            _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&leftScores._M_h,&leftScore);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
        ._M_cur != (__node_type *)0x0) {
      lVar2 = (long)_Var5._M_nxt[5]._M_nxt *
              *(long *)((long)cVar1.
                              super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                              ._M_cur + 0x28);
      if (lVar2 == 1 && uVar4 == 0) {
        uVar3 = *(long *)((long)cVar1.
                                super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                                ._M_cur + 0x20) << (m & 0x3f) | (ulong)_Var5._M_nxt[4]._M_nxt;
        uVar4 = 1;
      }
      else {
        uVar4 = uVar4 + lVar2;
      }
    }
    operator_delete(leftScore._M_data);
  }
  __return_storage_ptr__->size = uVar4;
  __return_storage_ptr__->solution = uVar3;
  std::
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&leftScores._M_h);
  std::
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&rightScores._M_h);
  return __return_storage_ptr__;
}

Assistant:

SolutionCollection Algorithm::runAlgorithm(const ExamResults& examResults)
{
	/**
	 * We split the answers of all students into two parts. We brute force
	 * The possible exam solution for each side and then combine the results
	 */
	const uint8_t splitIndex = examResults.questionCount / 2;

	/**
	 * The results of the brute force computation of each side is stored
	 * in a map. The key is a valarray of the score of each student and the
	 * value are the associated solution(s). This way we can easily compute
	 * what the corresponding key is to a score in a map because we can
	 * subtract the key from the obtained scores to obtain the required key
	 * for the other half.
	 */
	const auto rightScores = computeScoreMap(examResults, 0, splitIndex);
	const auto leftScores = computeScoreMap(examResults, splitIndex, examResults.questionCount);

	SolutionCollection solutions;

	// Combine the left and right scores
	for (const auto& [rightScore, rightSolutions] : rightScores) {
		const std::valarray<uint8_t> leftScore = examResults.scores - rightScore;

		const auto it = leftScores.find(leftScore);
		if (it == leftScores.end()) {
			continue;
		}

		const auto& leftSolutions = it->second;

		/**
		 * we only actually add the solutions here if the cardinality of the cartesian
		 * product is 1 since if it is larger we aren't interested in the actual solution
		 * just the number of them so we can just add dummy solutions
		 */
		auto combinationCount = leftSolutions.getSize() * rightSolutions.getSize();
		if (solutions.getSize() == 0 && combinationCount == 1) {
			solutions.addSolution((leftSolutions.getSolution() << splitIndex) | rightSolutions.getSolution());
		} else {
			solutions.grow(combinationCount);
		}
	}

	return solutions;
}